

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::reallocate
          (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this,size_t size)

{
  Expression **ppEVar1;
  ulong local_28;
  size_t i;
  Expression **old;
  size_t size_local;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_local;
  
  ppEVar1 = this->data;
  ArenaVector<wasm::Expression_*>::allocate((ArenaVector<wasm::Expression_*> *)this,size);
  for (local_28 = 0; local_28 < this->usedElements; local_28 = local_28 + 1) {
    this->data[local_28] = ppEVar1[local_28];
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }